

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall ktx::ValidationContext::validateIndices(ValidationContext *this)

{
  ktxIndexEntry32 *pkVar1;
  ktx_uint32_t *args_1;
  ktx_uint64_t *args;
  uint uVar2;
  uint uVar3;
  ktx_uint32_t kVar4;
  ktx_uint64_t kVar5;
  uint uVar6;
  ktxIndexEntry64 *extraout_RDX;
  ktxIndexEntry64 *args_00;
  ktxIndexEntry64 *extraout_RDX_00;
  ulong local_50;
  string local_48;
  
  uVar2 = (this->header).supercompressionScheme;
  uVar6 = (this->header).dataFormatDescriptor.byteOffset;
  pkVar1 = &(this->header).dataFormatDescriptor;
  args_1 = &(this->header).dataFormatDescriptor.byteLength;
  if ((uVar6 == 0) || ((this->header).dataFormatDescriptor.byteLength == 0)) {
    error<unsigned_int&,unsigned_int&>(this,&HeaderData::IndexDFDMissing,&pkVar1->byteOffset,args_1)
    ;
    uVar6 = (this->header).dataFormatDescriptor.byteOffset;
  }
  local_50 = (ulong)this->numLevels * 0x18 + 0x50;
  if (local_50 != uVar6) {
    error<unsigned_int&,unsigned_long&>
              (this,&HeaderData::IndexDFDInvalidOffset,&pkVar1->byteOffset,&local_50);
    uVar6 = (this->header).dataFormatDescriptor.byteOffset;
  }
  uVar3 = *args_1;
  local_50 = uVar3 + local_50;
  if (((uVar3 != 0 && uVar6 != 0) && (kVar4 = (this->header).keyValueData.byteOffset, kVar4 != 0))
     && (uVar6 = kVar4 - uVar6, uVar3 != uVar6)) {
    local_48._M_dataplus._M_p._0_4_ = uVar6;
    error<unsigned_int&,unsigned_int>
              (this,&HeaderData::IndexDFDInvalidLength,args_1,(uint *)&local_48);
  }
  pkVar1 = &(this->header).keyValueData;
  uVar6 = (this->header).keyValueData.byteLength;
  if (uVar6 == 0) {
    if (pkVar1->byteOffset != 0) {
      error<unsigned_int&>(this,&HeaderData::IndexKVDOffsetWithoutLength,&pkVar1->byteOffset);
    }
  }
  else {
    local_50 = local_50 + 3 & 0xfffffffffffffffc;
    if (local_50 != pkVar1->byteOffset) {
      error<unsigned_int&,unsigned_long&>
                (this,&HeaderData::IndexKVDInvalidOffset,&pkVar1->byteOffset,&local_50);
      uVar6 = (this->header).keyValueData.byteLength;
    }
    local_50 = uVar6 + local_50;
  }
  args_00 = &(this->header).supercompressionGlobalData;
  kVar5 = (this->header).supercompressionGlobalData.byteLength;
  if (kVar5 == 0) {
    if (args_00->byteOffset != 0) {
      error<unsigned_long&>(this,&HeaderData::IndexSGDOffsetWithoutLength,&args_00->byteOffset);
      args_00 = extraout_RDX_00;
    }
  }
  else {
    local_50 = local_50 + 7 & 0xfffffffffffffff8;
    if (local_50 != args_00->byteOffset) {
      error<unsigned_long&,unsigned_long&>
                (this,&HeaderData::IndexSGDInvalidOffset,&args_00->byteOffset,&local_50);
      kVar5 = (this->header).supercompressionGlobalData.byteLength;
      args_00 = extraout_RDX;
    }
    local_50 = local_50 + kVar5;
  }
  args = &(this->header).supercompressionGlobalData.byteLength;
  if (uVar2 == 1) {
    if (*args != 0) {
      return;
    }
    toString_abi_cxx11_(&local_48,(ktx *)0x1,(ktxSupercmpScheme)args_00);
    error<std::__cxx11::string>(this,&HeaderData::IndexSGDMissing,&local_48);
  }
  else {
    if ((uVar2 & 0xfffffffe) != 2) {
      return;
    }
    if (*args == 0) {
      return;
    }
    toString_abi_cxx11_(&local_48,(ktx *)(ulong)uVar2,(ktxSupercmpScheme)args_00);
    error<unsigned_long&,std::__cxx11::string>
              (this,&HeaderData::IndexSGDNotApplicable,args,&local_48);
  }
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void ValidationContext::validateIndices() {
    const auto supercompressionScheme = ktxSupercmpScheme(header.supercompressionScheme);

    // Validate dataFormatDescriptor index
    if (header.dataFormatDescriptor.byteOffset == 0 || header.dataFormatDescriptor.byteLength == 0)
        error(HeaderData::IndexDFDMissing, header.dataFormatDescriptor.byteOffset, header.dataFormatDescriptor.byteLength);

    const auto levelIndexSize = sizeof(ktxLevelIndexEntry) * numLevels;
    std::size_t expectedOffset = KTX2_HEADER_SIZE + levelIndexSize;
    expectedOffset = align(expectedOffset, std::size_t{4});
    if (expectedOffset != header.dataFormatDescriptor.byteOffset)
        error(HeaderData::IndexDFDInvalidOffset, header.dataFormatDescriptor.byteOffset, expectedOffset);
    expectedOffset += header.dataFormatDescriptor.byteLength;

    if (header.dataFormatDescriptor.byteOffset != 0 && header.dataFormatDescriptor.byteLength != 0)
        if (header.keyValueData.byteOffset != 0)
            if (header.dataFormatDescriptor.byteLength != header.keyValueData.byteOffset - header.dataFormatDescriptor.byteOffset)
                error(HeaderData::IndexDFDInvalidLength, header.dataFormatDescriptor.byteLength, header.keyValueData.byteOffset - header.dataFormatDescriptor.byteOffset);

    // Validate keyValueData index
    if (header.keyValueData.byteLength != 0) {
        expectedOffset = align(expectedOffset, std::size_t{4});
        if (expectedOffset != header.keyValueData.byteOffset)
            error(HeaderData::IndexKVDInvalidOffset, header.keyValueData.byteOffset, expectedOffset);
        expectedOffset += header.keyValueData.byteLength;
    } else {
        if (header.keyValueData.byteOffset != 0)
            error(HeaderData::IndexKVDOffsetWithoutLength, header.keyValueData.byteOffset);
    }

    // Validate supercompressionGlobalData index
    if (header.supercompressionGlobalData.byteLength != 0) {
        expectedOffset = align(expectedOffset, std::size_t{8});
        if (expectedOffset != header.supercompressionGlobalData.byteOffset)
            error(HeaderData::IndexSGDInvalidOffset, header.supercompressionGlobalData.byteOffset, expectedOffset);
        expectedOffset += header.supercompressionGlobalData.byteLength;
    } else {
        if (header.supercompressionGlobalData.byteOffset != 0)
            error(HeaderData::IndexSGDOffsetWithoutLength, header.supercompressionGlobalData.byteOffset);
    }

    if (isSupercompressionWithGlobalData(supercompressionScheme)) {
        if (header.supercompressionGlobalData.byteLength == 0)
            error(HeaderData::IndexSGDMissing, toString(supercompressionScheme));
    } else if (isSupercompressionWithNoGlobalData(supercompressionScheme)) {
        if (header.supercompressionGlobalData.byteLength != 0)
            error(HeaderData::IndexSGDNotApplicable, header.supercompressionGlobalData.byteLength, toString(supercompressionScheme));
    }
}